

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::setButtonLayout(QWizard *this,QList<QWizard::WizardButton> *layout)

{
  WizardButton *pWVar1;
  WizardButton which;
  QWizardPrivate *this_00;
  bool bVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  uVar4 = 0;
  do {
    if ((ulong)(layout->d).size <= uVar4) {
      this_00->buttonsHaveCustomLayout = true;
      QArrayDataPointer<QWizard::WizardButton>::operator=
                (&(this_00->buttonsCustomLayout).d,&layout->d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWizardPrivate::updateButtonLayout(this_00);
        return;
      }
LAB_004c47e0:
      __stack_chk_fail();
    }
    which = (layout->d).ptr[uVar4];
    if ((which != NoButton) && (which != NButtons)) {
      bVar2 = QWizardPrivate::ensureButton(this_00,which);
      if (!bVar2) {
LAB_004c478d:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return;
        }
        goto LAB_004c47e0;
      }
      uVar3 = 0;
      while (uVar4 != uVar3) {
        pWVar1 = (layout->d).ptr + uVar3;
        uVar3 = uVar3 + 1;
        if (*pWVar1 == which) {
          local_48[0] = '\x02';
          local_48[1] = '\0';
          local_48[2] = '\0';
          local_48[3] = '\0';
          local_48[0x14] = '\0';
          local_48[0x15] = '\0';
          local_48[0x16] = '\0';
          local_48[0x17] = '\0';
          local_48[4] = '\0';
          local_48[5] = '\0';
          local_48[6] = '\0';
          local_48[7] = '\0';
          local_48[8] = '\0';
          local_48[9] = '\0';
          local_48[10] = '\0';
          local_48[0xb] = '\0';
          local_48[0xc] = '\0';
          local_48[0xd] = '\0';
          local_48[0xe] = '\0';
          local_48[0xf] = '\0';
          local_48[0x10] = '\0';
          local_48[0x11] = '\0';
          local_48[0x12] = '\0';
          local_48[0x13] = '\0';
          local_30 = "default";
          QMessageLogger::warning(local_48,"QWizard::setButtonLayout: Duplicate button in layout");
          goto LAB_004c478d;
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void QWizard::setButtonLayout(const QList<WizardButton> &layout)
{
    Q_D(QWizard);

    for (int i = 0; i < layout.size(); ++i) {
        WizardButton button1 = layout.at(i);

        if (button1 == NoButton || button1 == Stretch)
            continue;
        if (!d->ensureButton(button1))
            return;

        // O(n^2), but n is very small
        for (int j = 0; j < i; ++j) {
            WizardButton button2 = layout.at(j);
            if (Q_UNLIKELY(button2 == button1)) {
                qWarning("QWizard::setButtonLayout: Duplicate button in layout");
                return;
            }
        }
    }

    d->buttonsHaveCustomLayout = true;
    d->buttonsCustomLayout = layout;
    d->updateButtonLayout();
}